

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t spvtools::val::MaximalReconvergenceChecks(ValidationState_t *_)

{
  bool bVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  reference puVar5;
  size_type sVar6;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *pvVar7;
  reference puVar8;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *pvVar9;
  Function *this_00;
  size_type sVar10;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar11;
  reference ppBVar12;
  Instruction *pIVar13;
  const_reference pvVar14;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *this_01;
  DiagnosticStream *pDVar15;
  DiagnosticStream local_658;
  Instruction *local_480;
  Instruction *use_inst;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *pair;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range4_1;
  bool ok;
  Instruction *label;
  value_type *pre_terminator;
  long index;
  Instruction *terminator;
  uint32_t local_41c;
  BasicBlock *local_418;
  BasicBlock *pred;
  const_iterator __end4;
  const_iterator __begin4;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range4;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *preds;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  unique_preds;
  BasicBlock *block;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range3_1;
  reference local_390;
  Function *func_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *__range2_3;
  uint32_t local_194;
  uint local_190;
  uint local_18c;
  uint false_id;
  uint true_id;
  Instruction *inst;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *__range2_2;
  uint32_t local_158;
  uint local_154;
  iterator iStack_150;
  uint id;
  iterator __end3;
  iterator __begin3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_108;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *entry_points;
  Function *func;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *__range2_1;
  key_type local_b4;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *local_b0;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *exec_modes;
  const_iterator cStack_a0;
  uint entry_point;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  maximal_entry_points;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  maximal_funcs;
  ValidationState_t *__local;
  
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&maximal_entry_points._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2);
  this = ValidationState_t::entry_points(_);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this);
  cStack_a0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff60), bVar1) {
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    exec_modes._4_4_ = *puVar5;
    local_b0 = ValidationState_t::GetExecutionModes(_,exec_modes._4_4_);
    bVar1 = false;
    if (local_b0 !=
        (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
         *)0x0) {
      local_b4 = ExecutionModeMaximallyReconvergesKHR;
      sVar6 = std::
              set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
              ::count(local_b0,&local_b4);
      bVar1 = sVar6 != 0;
    }
    if (bVar1) {
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&__range2,(value_type *)((long)&exec_modes + 4));
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&maximal_entry_points._M_h._M_single_bucket,(value_type *)((long)&exec_modes + 4))
      ;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::empty((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2);
  if (bVar1) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    pvVar7 = ValidationState_t::functions(_);
    __end2_1 = std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::begin
                         (pvVar7);
    func = (Function *)
           std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::end
                     (pvVar7);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
                               *)&func), bVar1) {
      entry_points = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     __gnu_cxx::
                     __normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
                     ::operator*(&__end2_1);
      uVar4 = Function::id((Function *)entry_points);
      ValidationState_t::EntryPointReferences
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &__range3,_,uVar4);
      local_108 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  &__range3;
      __end3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                         ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&__range3);
      iStack_150 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &__range3);
      while (bVar1 = std::operator!=(&__end3,&stack0xfffffffffffffeb0), bVar1) {
        puVar8 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end3);
        local_154 = *puVar8;
        sVar10 = std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&__range2,&local_154);
        if (sVar10 != 0) {
          local_158 = Function::id((Function *)entry_points);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&maximal_entry_points._M_h._M_single_bucket,&local_158);
          break;
        }
        std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end3);
      }
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &__range3);
      __gnu_cxx::
      __normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
      ::operator++(&__end2_1);
    }
    pvVar9 = ValidationState_t::ordered_instructions(_);
    __end2_2 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ::begin(pvVar9);
    inst = (Instruction *)
           std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::end
                     (pvVar9);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                               *)&inst), bVar1) {
      _false_id = __gnu_cxx::
                  __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                  ::operator*(&__end2_2);
      OVar3 = Instruction::opcode(_false_id);
      if (OVar3 == OpBranchConditional) {
        local_18c = Instruction::GetOperandAs<unsigned_int>(_false_id,1);
        local_190 = Instruction::GetOperandAs<unsigned_int>(_false_id,2);
        bVar1 = false;
        if (local_18c == local_190) {
          this_00 = Instruction::function(_false_id);
          local_194 = Function::id(this_00);
          sVar10 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&maximal_entry_points._M_h._M_single_bucket,&local_194);
          bVar1 = sVar10 != 0;
        }
        if (bVar1) {
          ValidationState_t::diag((DiagnosticStream *)&__range2_3,_,SPV_ERROR_INVALID_ID,_false_id);
          pDVar15 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)&__range2_3,
                               (char (*) [118])
                               "In entry points using the MaximallyReconvergesKHR execution mode, True Label and False Label must be different labels"
                              );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar15);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&__range2_3);
          goto LAB_00265a45;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
      ::operator++(&__end2_2);
    }
    pvVar7 = ValidationState_t::functions(_);
    __end2_3 = std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::begin
                         (pvVar7);
    func_1 = (Function *)
             std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::end
                       (pvVar7);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
                               *)&func_1), bVar1) {
      local_390 = __gnu_cxx::
                  __normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
                  ::operator*(&__end2_3);
      __range3_1._4_4_ = Function::id(local_390);
      sVar10 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&maximal_entry_points._M_h._M_single_bucket,
                       (key_type *)((long)&__range3_1 + 4));
      if (sVar10 != 0) {
        pvVar11 = Function::ordered_blocks(local_390);
        __end3_1 = std::
                   vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   ::begin(pvVar11);
        block = (BasicBlock *)
                std::
                vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
                end(pvVar11);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                   *)&block), bVar1) {
          ppBVar12 = __gnu_cxx::
                     __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                     ::operator*(&__end3_1);
          unique_preds._M_h._M_single_bucket = (__node_base_ptr)*ppBVar12;
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&preds);
          pvVar11 = BasicBlock::predecessors((BasicBlock *)unique_preds._M_h._M_single_bucket);
          if (pvVar11 ==
              (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
              0x0) {
            __range2_1._4_4_ = 0xd;
          }
          else {
            __end4 = std::
                     vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     ::begin(pvVar11);
            pred = (BasicBlock *)
                   std::
                   vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   ::end(pvVar11);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                               *)&pred), bVar1) {
              ppBVar12 = __gnu_cxx::
                         __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                         ::operator*(&__end4);
              local_418 = *ppBVar12;
              local_41c = BasicBlock::id(local_418);
              std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&preds,&local_41c);
              __gnu_cxx::
              __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
              ::operator++(&__end4);
            }
            sVar10 = std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::size((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&preds);
            if (sVar10 < 2) {
              __range2_1._4_4_ = 0xd;
            }
            else {
              pIVar13 = BasicBlock::terminator((BasicBlock *)unique_preds._M_h._M_single_bucket);
              pvVar9 = ValidationState_t::ordered_instructions(_);
              pvVar14 = std::
                        vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                        ::operator[](pvVar9,0);
              pvVar9 = ValidationState_t::ordered_instructions(_);
              pvVar14 = std::
                        vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                        ::operator[](pvVar9,((long)pIVar13 - (long)pvVar14) / 0x88 - 1);
              OVar3 = Instruction::opcode(pvVar14);
              if (OVar3 == OpLoopMerge) {
                __range2_1._4_4_ = 0xd;
              }
              else {
                uVar4 = BasicBlock::id((BasicBlock *)unique_preds._M_h._M_single_bucket);
                pIVar13 = ValidationState_t::FindDef(_,uVar4);
                bVar1 = false;
                this_01 = Instruction::uses(pIVar13);
                __end4_1 = std::
                           vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                           ::begin(this_01);
                pair = (pair<const_spvtools::val::Instruction_*,_unsigned_int> *)
                       std::
                       vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                       ::end(this_01);
                while (bVar2 = __gnu_cxx::operator!=
                                         (&__end4_1,
                                          (__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                                           *)&pair), bVar2) {
                  use_inst = (Instruction *)
                             __gnu_cxx::
                             __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                             ::operator*(&__end4_1);
                  local_480 = (Instruction *)
                              (use_inst->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  OVar3 = Instruction::opcode(local_480);
                  if ((OVar3 - OpLoopMerge < 2) || (OVar3 == OpSwitch)) {
                    bVar1 = true;
                  }
                  __gnu_cxx::
                  __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                  ::operator++(&__end4_1);
                }
                if (bVar1) {
                  __range2_1._4_4_ = 0;
                }
                else {
                  ValidationState_t::diag(&local_658,_,SPV_ERROR_INVALID_CFG,pIVar13);
                  pDVar15 = DiagnosticStream::operator<<
                                      (&local_658,
                                       (char (*) [126])
                                       "In entry points using the MaximallyReconvergesKHR execution mode, this basic block must not have multiple unique predecessors"
                                      );
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar15);
                  DiagnosticStream::~DiagnosticStream(&local_658);
                  __range2_1._4_4_ = 1;
                }
              }
            }
          }
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&preds);
          if ((__range2_1._4_4_ != 0) && (__range2_1._4_4_ != 0xd)) goto LAB_00265a45;
          __gnu_cxx::
          __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
          ::operator++(&__end3_1);
        }
      }
      __gnu_cxx::
      __normal_iterator<spvtools::val::Function_*,_std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>_>
      ::operator++(&__end2_3);
    }
    __local._4_4_ = SPV_SUCCESS;
  }
LAB_00265a45:
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&maximal_entry_points._M_h._M_single_bucket);
  return __local._4_4_;
}

Assistant:

spv_result_t MaximalReconvergenceChecks(ValidationState_t& _) {
  // Find all the entry points with the MaximallyReconvergencesKHR execution
  // mode.
  std::unordered_set<uint32_t> maximal_funcs;
  std::unordered_set<uint32_t> maximal_entry_points;
  for (auto entry_point : _.entry_points()) {
    const auto* exec_modes = _.GetExecutionModes(entry_point);
    if (exec_modes &&
        exec_modes->count(spv::ExecutionMode::MaximallyReconvergesKHR)) {
      maximal_entry_points.insert(entry_point);
      maximal_funcs.insert(entry_point);
    }
  }

  if (maximal_entry_points.empty()) {
    return SPV_SUCCESS;
  }

  // Find all the functions reachable from a maximal reconvergence entry point.
  for (const auto& func : _.functions()) {
    const auto& entry_points = _.EntryPointReferences(func.id());
    for (auto id : entry_points) {
      if (maximal_entry_points.count(id)) {
        maximal_funcs.insert(func.id());
        break;
      }
    }
  }

  // Check for conditional branches with the same true and false targets.
  for (const auto& inst : _.ordered_instructions()) {
    if (inst.opcode() == spv::Op::OpBranchConditional) {
      const auto true_id = inst.GetOperandAs<uint32_t>(1);
      const auto false_id = inst.GetOperandAs<uint32_t>(2);
      if (true_id == false_id && maximal_funcs.count(inst.function()->id())) {
        return _.diag(SPV_ERROR_INVALID_ID, &inst)
               << "In entry points using the MaximallyReconvergesKHR execution "
                  "mode, True Label and False Label must be different labels";
      }
    }
  }

  // Check for invalid multiple predecessors. Only loop headers, continue
  // targets, merge targets or switch targets or defaults may have multiple
  // unique predecessors.
  for (const auto& func : _.functions()) {
    if (!maximal_funcs.count(func.id())) continue;

    for (const auto* block : func.ordered_blocks()) {
      std::unordered_set<uint32_t> unique_preds;
      const auto* preds = block->predecessors();
      if (!preds) continue;

      for (const auto* pred : *preds) {
        unique_preds.insert(pred->id());
      }
      if (unique_preds.size() < 2) continue;

      const auto* terminator = block->terminator();
      const auto index = terminator - &_.ordered_instructions()[0];
      const auto* pre_terminator = &_.ordered_instructions()[index - 1];
      if (pre_terminator->opcode() == spv::Op::OpLoopMerge) continue;

      const auto* label = _.FindDef(block->id());
      bool ok = false;
      for (const auto& pair : label->uses()) {
        const auto* use_inst = pair.first;
        switch (use_inst->opcode()) {
          case spv::Op::OpSelectionMerge:
          case spv::Op::OpLoopMerge:
          case spv::Op::OpSwitch:
            ok = true;
            break;
          default:
            break;
        }
      }
      if (!ok) {
        return _.diag(SPV_ERROR_INVALID_CFG, label)
               << "In entry points using the MaximallyReconvergesKHR "
                  "execution mode, this basic block must not have multiple "
                  "unique predecessors";
      }
    }
  }

  return SPV_SUCCESS;
}